

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testAttrPreview(string *tempdir)

{
  int iVar1;
  exr_context_t p_Var2;
  long lVar3;
  char *pcVar4;
  undefined4 *puVar5;
  ostream *poVar6;
  size_t sVar7;
  char *in_RCX;
  char *pcVar8;
  _internal_exr_context *pctxt;
  int iVar9;
  exr_context_t f;
  exr_context_t local_20;
  
  p_Var2 = createDummyFile("<preview>");
  local_20 = p_Var2;
  if (p_Var2 == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(p_Var2 + 0x40))
                      (p_Var2,3,"Invalid reference to preview object to initialize");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(3);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, __null, 64, 64)",(char *)0x31f,0x18137c,in_RCX);
  }
  if (p_Var2 == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(2);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_destroy (f, __null)",(char *)0x322,0x18137c,in_RCX);
  }
  pcVar8 = (char *)0xffffffff;
  iVar1 = (**(code **)(p_Var2 + 0x48))
                    (p_Var2,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                     0xffffffff,0x40,0xffffffff00);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, &p, (uint32_t) -1, 64)",(char *)0x325,0x18137c,pcVar8)
    ;
  }
  iVar9 = 0;
  pcVar8 = (char *)0x40;
  iVar1 = (**(code **)(p_Var2 + 0x48))
                    (p_Var2,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",0x40
                     ,0xffffffff,0xffffffff00);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, &p, 64, (uint32_t) -1)",(char *)0x328,0x18137c,pcVar8)
    ;
  }
  lVar3 = (**(code **)(p_Var2 + 0x58))(4);
  if (lVar3 == 0) {
    iVar9 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
  }
  if (iVar9 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar9);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x329,0x18137c,pcVar8);
  }
  if (lVar3 == 0) {
    core_test_fail("p.width == 1",(char *)0x32a,0x18137c,pcVar8);
  }
  (**(code **)(p_Var2 + 0x60))(lVar3);
  s_malloc_fail_on = 1;
  lVar3 = (**(code **)(p_Var2 + 0x58))(4);
  iVar1 = 0;
  if (lVar3 == 0) {
    iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
  }
  s_malloc_fail_on = 0;
  if (iVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x334,0x18137c,pcVar8);
  }
  pcVar4 = (char *)(**(code **)(p_Var2 + 0x58))(4);
  iVar1 = 0;
  if (pcVar4 == (char *)0x0) {
    iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x336,0x18137c,pcVar8);
  }
  pcVar4[0] = -0x22;
  pcVar4[1] = -0x53;
  pcVar4[2] = -0x42;
  pcVar4[3] = -0x11;
  if (pcVar4 == (char *)0x0) {
    core_test_fail("p.width == 1",(char *)0x337,0x18137c,pcVar8);
  }
  if (*pcVar4 != -0x22) {
    core_test_fail("p.rgba[0] == 0xDE",(char *)0x33b,0x18137c,pcVar8);
  }
  if (pcVar4[1] != -0x53) {
    core_test_fail("p.rgba[1] == 0xAD",(char *)0x33c,0x18137c,pcVar8);
  }
  if (pcVar4[2] != -0x42) {
    core_test_fail("p.rgba[2] == 0xBE",(char *)0x33d,0x18137c,pcVar8);
  }
  if (pcVar4[3] != -0x11) {
    core_test_fail("p.rgba[3] == 0xEF",(char *)0x33e,0x18137c,pcVar8);
  }
  (**(code **)(p_Var2 + 0x60))(pcVar4);
  s_malloc_fail_on = 1;
  puVar5 = (undefined4 *)(**(code **)(p_Var2 + 0x58))(4);
  iVar1 = 0;
  if (puVar5 == (undefined4 *)0x0) {
    iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
  }
  if (iVar1 == 0) {
    *puVar5 = 0xefbeadde;
  }
  s_malloc_fail_on = 0;
  if (iVar1 == 1) {
    exr_finish(&local_20);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
  pcVar4 = (char *)exr_get_default_error_message(iVar1);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
  pcVar4 = (char *)exr_get_default_error_message(1);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x344,0x18137c,pcVar8);
}

Assistant:

void
testAttrPreview (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testPreviewHelper (NULL);
    exr_context_t f = createDummyFile ("<preview>");
    testPreviewHelper (f);
    exr_finish (&f);
}